

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::LargeObjectHeader::SetNext(LargeObjectHeader *this,uint cookie,LargeObjectHeader *next)

{
  byte bVar1;
  ushort uVar2;
  LargeObjectHeader *pLVar3;
  ushort newAttributeWithCheckSum;
  uchar newCheckSumValue;
  ushort decodedAttributesAndChecksum;
  LargeObjectHeader *next_local;
  uint cookie_local;
  LargeObjectHeader *this_local;
  
  uVar2 = DecodeAttributesAndChecksum(this,cookie);
  bVar1 = CalculateCheckSum(this,next,(uchar)(uVar2 >> 8));
  uVar2 = EncodeAttributesAndChecksum(this,cookie,uVar2 & 0xff00 | (ushort)bVar1);
  this->attributesAndChecksum = uVar2;
  pLVar3 = EncodeNext(this,cookie,next);
  this->next = pLVar3;
  return;
}

Assistant:

void
LargeObjectHeader::SetNext(uint cookie, LargeObjectHeader* next)
{
#ifdef LARGEHEAPBLOCK_ENCODING
    ushort decodedAttributesAndChecksum = this->DecodeAttributesAndChecksum(cookie);

    // Calculate the checksum value with new next
    unsigned char newCheckSumValue = this->CalculateCheckSum(next, (unsigned char)(decodedAttributesAndChecksum >> 8));
    // pack the (attribute + checksum)
    ushort newAttributeWithCheckSum = (decodedAttributesAndChecksum & 0xFF00) | newCheckSumValue;

    // encode the packed (attribute + checksum), next and set them
    this->attributesAndChecksum = this->EncodeAttributesAndChecksum(cookie, newAttributeWithCheckSum);
    this->next = this->EncodeNext(cookie, next);
#else
    this->next = next;
#endif
}